

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TheoryAxioms.cpp
# Opt level: O3

void __thiscall
Shell::TheoryAxioms::addQuotientAxioms
          (TheoryAxioms *this,Interpretation quotient,Interpretation multiply,TermList zeroElement,
          TermList oneElement,Interpretation less)

{
  Signature *pSVar1;
  uint fn;
  uint fn_00;
  TermList sort;
  OperatorType *pOVar2;
  Literal *pLVar3;
  TermList TVar4;
  initializer_list<Kernel::Literal_*> lits;
  initializer_list<Kernel::Literal_*> lits_00;
  Literal *local_40;
  Literal *local_38;
  
  sort = Kernel::Theory::getOperationSort(quotient);
  pSVar1 = DAT_00b521b0;
  pOVar2 = Kernel::Theory::getNonpolymorphicOperatorType(multiply);
  fn = Kernel::Signature::getInterpretingSymbol(pSVar1,multiply,pOVar2);
  pSVar1 = DAT_00b521b0;
  pOVar2 = Kernel::Theory::getNonpolymorphicOperatorType(quotient);
  fn_00 = Kernel::Signature::getInterpretingSymbol(pSVar1,quotient,pOVar2);
  pLVar3 = Kernel::Literal::createEquality(true,(TermList)0x5,zeroElement,sort);
  TVar4._content = (uint64_t)Kernel::Term::create2(fn_00,oneElement,(TermList)0x5);
  local_38 = Kernel::Literal::createEquality(false,TVar4,zeroElement,sort);
  lits._M_len = 2;
  lits._M_array = &local_40;
  local_40 = pLVar3;
  addTheoryClauseFromLits(this,lits,THA_QUOTIENT_NON_ZERO,1);
  TVar4._content = (uint64_t)Kernel::Term::create2(fn,(TermList)0x9,(TermList)0x5);
  TVar4._content = (uint64_t)Kernel::Term::create2(fn_00,TVar4,(TermList)0x5);
  local_38 = Kernel::Literal::createEquality(true,TVar4,(TermList)0x9,sort);
  lits_00._M_len = 2;
  lits_00._M_array = &local_40;
  local_40 = pLVar3;
  addTheoryClauseFromLits(this,lits_00,THA_QUOTIENT_MULTIPLY,1);
  return;
}

Assistant:

void TheoryAxioms::addQuotientAxioms(Interpretation quotient, Interpretation multiply,
    TermList zeroElement, TermList oneElement, Interpretation less)
{
  TermList srt = theory->getOperationSort(quotient);
  ASS_EQ(srt, theory->getOperationSort(multiply));
  ASS_EQ(srt, theory->getOperationSort(less));

  TermList x(1,false);
  TermList y(2,false);

  unsigned mulFun = env.signature->getInterpretingSymbol(multiply);
  unsigned divFun = env.signature->getInterpretingSymbol(quotient);

  Literal* guardx = Literal::createEquality(true,x,zeroElement,srt); 

  // x=0 | quotient(x,x)=1, easily derivable!
  //TermList qXX(Term::create2(quotient,x,x));
  //Literal* xQxis1 = Literal::createEquality(true,qXX,oneElement,srt);
  //addTheoryNonUnitClause(guardx,xQxis1);

  // x=0 | quotient(1,x)!=0
  TermList q1X(Term::create2(divFun,oneElement,x));
  Literal* oQxnot0 = Literal::createEquality(false,q1X,zeroElement,srt);
  addTheoryClauseFromLits({guardx,oQxnot0}, InferenceRule::THA_QUOTIENT_NON_ZERO, EXPENSIVE);

  // quotient(x,1)=x, easily derivable!
  //TermList qX1(Term::create2(quotient,x,oneElement));
  //Literal* qx1isx = Literal::createEquality(true,qX1,x,srt);
  //addTheoryUnitClause(qx1isx);

  // x=0 | quotient(multiply(y,x),x)=y
  TermList myx(Term::create2(mulFun,y,x));
  TermList qmx(Term::create2(divFun,myx,x));
  Literal* qmxisy = Literal::createEquality(true,qmx,y,srt);

  addTheoryClauseFromLits({guardx,qmxisy}, InferenceRule::THA_QUOTIENT_MULTIPLY, EXPENSIVE);
}